

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Filter.cpp
# Opt level: O3

void __thiscall rtb::Filter::Filter<double>::resetState(Filter<double> *this)

{
  pointer pcVar1;
  pointer pcVar2;
  
  pcVar1 = (this->x_).
           super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>._M_impl.
           super__Vector_impl_data._M_start;
  pcVar2 = (this->x_).
           super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (pcVar1 != pcVar2) {
    memset(pcVar1,0,((long)pcVar2 + (-0x10 - (long)pcVar1) & 0xfffffffffffffff0U) + 0x10);
  }
  pcVar1 = (this->y_).
           super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>._M_impl.
           super__Vector_impl_data._M_start;
  pcVar2 = (this->y_).
           super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (pcVar1 != pcVar2) {
    memset(pcVar1,0,((long)pcVar2 + (-0x10 - (long)pcVar1) & 0xfffffffffffffff0U) + 0x10);
  }
  this->count_ = 0;
  return;
}

Assistant:

void Filter<T>::resetState() {
            for (auto& element : x_)
                element = 0;
            for (auto& element : y_)
                element = 0;

            count_ = 0;
        }